

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfdcapi_elements_transaction_BlindTransaction_Test::TestBody
          (cfdcapi_elements_transaction_BlindTransaction_Test *this)

{
  bool bVar1;
  char *in_R9;
  int64_t *piVar2;
  char *pcVar3;
  char *in_stack_ffffffffffffff18;
  AssertionResult gtest_ar_;
  char *asset_value_blind_factor;
  int ret;
  int64_t value;
  AssertionResult gtest_ar;
  undefined1 local_a8 [22];
  bool is_issuance_token;
  bool is_issuance_asset;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  char *asset_blind_factor;
  char *asset;
  AssertHelper local_78;
  char *value_blind_factor;
  void *handle;
  void *blind_handle;
  char *token;
  char *tx_string;
  uint32_t issuance_vout;
  uint32_t vout;
  char *issuance_txid;
  char *token_value_blind_factor;
  char *token_blind_factor;
  int64_t token_value;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx_string,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x30f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx_string,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_string);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar_.success_ = handle != (void *)0x0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&tx_string);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&blind_handle,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x310,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&blind_handle,(Message *)&tx_string);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&blind_handle);
    if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_a8) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (tx_string != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tx_string != (char *)0x0)) {
        (**(code **)(*(long *)tx_string + 8))();
      }
      tx_string = (char *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  tx_string = (char *)0x0;
  blind_handle = (void *)0x0;
  ret = CfdInitializeBlindTx(handle,&blind_handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x318,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (ret == 0) {
    ret = CfdAddBlindTxInData(handle,blind_handle,
                              "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",0,
                              "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179",
                              "a10ecbe1be7a5f883d5d45d966e30dbc1beff5f21c55cec76cc21a2229116a9f",
                              "ae0f46d1940f297c2dc3bbd82bf8ef6931a2431fbb05b3d3bc5df41af86ae808",
                              0x3b9542b0,(char *)0x0,(char *)0x0);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x323,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    ret = CfdAddBlindTxInData(handle,blind_handle,
                              "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",1,
                              "ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b",
                              "0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8",
                              "62e36e1f0fa4916b031648a6b6903083069fa587572a88b729250cde528cfd3b",
                              700000000,
                              "7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f",
                              "7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f");
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x330,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    ret = CfdAddBlindTxOutData
                    (handle,blind_handle,0,
                     "02200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d");
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x337,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    ret = CfdAddBlindTxOutData
                    (handle,blind_handle,1,
                     "02cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a");
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x33e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    ret = CfdAddBlindTxOutByAddress
                    (handle,blind_handle,
                     "CTExCoUri8VzkxbbhqzgsruWJ5zYtmoFXxCWtjiSLAzcMbpEWhHmDrZ66bAb41VsmSKnvJWrq2cfjUw9"
                    );
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x345,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    ret = CfdSetBlindTxOption(handle,blind_handle,1,1);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x34b,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    ret = CfdSetBlindTxOption(handle,blind_handle,2,0);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x351,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    ret = CfdSetBlindTxOption(handle,blind_handle,3,0x34);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x357,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    ret = CfdSetBlindTxOption(handle,blind_handle,4,1);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x35d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if (ret == 0) {
    ret = CfdFinalizeBlindTx(handle,blind_handle,
                             "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000"
                             ,&tx_string);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x362,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  vout = 0;
  value = 0;
  asset = (char *)0x0;
  asset_blind_factor = (char *)0x0;
  value_blind_factor = (char *)0x0;
  issuance_txid = (char *)0x0;
  issuance_vout = 0;
  is_issuance_asset = false;
  is_issuance_token = false;
  if (ret == 0) {
    piVar2 = &value;
    ret = CfdGetBlindTxBlindData
                    (handle,blind_handle,0,&vout,&asset,piVar2,&asset_blind_factor,
                     &value_blind_factor,&issuance_txid,&issuance_vout,&is_issuance_asset,
                     &is_issuance_token);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x376,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      gtest_ar_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&gtest_ar,"1","vout",(int *)&gtest_ar_,&vout);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x379,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd\"","asset",
                 "accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd",asset);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x37a,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar_._0_4_ = 600000000;
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)&gtest_ar,"600000000","value",(int *)&gtest_ar_,&value);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x37b,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,"empty_factor","asset_blind_factor",
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 asset_blind_factor);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x37c,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTRNE
                (asset_value_blind_factor,(char *)gtest_ar_.message_.ptr_,(char *)gtest_ar_._0_8_,
                 in_stack_ffffffffffffff18);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x37d,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f\"",
                 "issuance_txid","57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",
                 issuance_txid);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x37f,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&gtest_ar,"1","issuance_vout",(int *)&gtest_ar_,&issuance_vout);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x380,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar_.success_ = is_issuance_asset;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (is_issuance_asset == false) {
        testing::Message::Message((Message *)&asset_value_blind_factor);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"is_issuance_asset"
                   ,"false","true",(char *)piVar2);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&token,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x381,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&token,(Message *)&asset_value_blind_factor);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&token);
        if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_a8) {
          operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        }
        if (asset_value_blind_factor != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (asset_value_blind_factor != (char *)0x0)) {
            (**(code **)(*(long *)asset_value_blind_factor + 8))();
          }
          asset_value_blind_factor = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,is_issuance_token) ^ 1;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (is_issuance_token != false) {
        testing::Message::Message((Message *)&asset_value_blind_factor);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"is_issuance_token"
                   ,"true","false",(char *)piVar2);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&token,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x382,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&token,(Message *)&asset_value_blind_factor);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&token);
        if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_a8) {
          operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        }
        if (asset_value_blind_factor != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (asset_value_blind_factor != (char *)0x0)) {
            (**(code **)(*(long *)asset_value_blind_factor + 8))();
          }
          asset_value_blind_factor = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(value_blind_factor);
      CfdFreeStringBuffer(issuance_txid);
      asset = (char *)0x0;
      asset_blind_factor = (char *)0x0;
      value_blind_factor = (char *)0x0;
      issuance_txid = (char *)0x0;
    }
  }
  if (ret == 0) {
    piVar2 = &value;
    ret = CfdGetBlindTxBlindData
                    (handle,blind_handle,2,&vout,&asset,piVar2,&asset_blind_factor,
                     &value_blind_factor,&issuance_txid,&issuance_vout,&is_issuance_asset,
                     &is_issuance_token);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x393,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      gtest_ar_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&gtest_ar,"1","vout",(int *)&gtest_ar_,&vout);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x396,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b\"","asset",
                 "ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b",asset);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x397,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar_._0_4_ = 700000000;
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)&gtest_ar,"700000000","value",(int *)&gtest_ar_,&value);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x398,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTRNE
                (asset_value_blind_factor,(char *)gtest_ar_.message_.ptr_,(char *)gtest_ar_._0_8_,
                 in_stack_ffffffffffffff18);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x399,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTRNE
                (asset_value_blind_factor,(char *)gtest_ar_.message_.ptr_,(char *)gtest_ar_._0_8_,
                 in_stack_ffffffffffffff18);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x39a,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pcVar3 = "";
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,"\"\"","issuance_txid","",issuance_txid);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x39b,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                ((internal *)&gtest_ar,"0","issuance_vout",(int *)&gtest_ar_,&issuance_vout);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x39c,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,is_issuance_asset) ^ 1;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (is_issuance_asset != false) {
        testing::Message::Message((Message *)&asset_value_blind_factor);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"is_issuance_asset"
                   ,"true","false",(char *)piVar2);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&token,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x39d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&token,(Message *)&asset_value_blind_factor);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&token);
        if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_a8) {
          operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        }
        if (asset_value_blind_factor != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (asset_value_blind_factor != (char *)0x0)) {
            (**(code **)(*(long *)asset_value_blind_factor + 8))();
          }
          asset_value_blind_factor = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,is_issuance_token) ^ 1;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (is_issuance_token != false) {
        testing::Message::Message((Message *)&asset_value_blind_factor);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"is_issuance_token"
                   ,"true","false",(char *)piVar2);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&token,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x39e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&token,(Message *)&asset_value_blind_factor);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&token);
        if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_a8) {
          operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        }
        if (asset_value_blind_factor != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (asset_value_blind_factor != (char *)0x0)) {
            (**(code **)(*(long *)asset_value_blind_factor + 8))();
          }
          asset_value_blind_factor = (char *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(value_blind_factor);
      CfdFreeStringBuffer(issuance_txid);
      asset = (char *)0x0;
      asset_blind_factor = (char *)0x0;
      value_blind_factor = (char *)0x0;
      issuance_txid = (char *)0x0;
    }
  }
  if (ret == 0) {
    ret = CfdGetBlindTxBlindData
                    (handle,blind_handle,4,&vout,&asset,&value,&asset_blind_factor,
                     &value_blind_factor,&issuance_txid,&issuance_vout,&is_issuance_asset,
                     &is_issuance_token);
    gtest_ar_._0_4_ = 3;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdOutOfRangeError","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x3af,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 3) {
      ret = 0;
    }
  }
  if (blind_handle != (void *)0x0) {
    CfdFreeBlindHandle(handle,blind_handle);
  }
  if (ret == 0) {
    asset_value_blind_factor = (char *)0x0;
    token = (char *)0x0;
    token_value = 0;
    token_blind_factor = (char *)0x0;
    token_value_blind_factor = (char *)0x0;
    ret = CfdUnblindIssuance(handle,tx_string,1,
                             "7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f",
                             "7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f",
                             &asset,(int64_t *)&gtest_ar_,&asset_blind_factor,
                             &asset_value_blind_factor,&token,&token_value,&token_blind_factor,
                             &token_value_blind_factor);
    local_90.ptr_ = local_90.ptr_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_90,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_90);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x3c6,pcVar3);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_90.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_90.ptr_ + 8))();
        }
        local_90.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd\"","asset",
                 "accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd",asset);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_90);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3c8,pcVar3);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_90.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_90.ptr_ + 8))();
          }
          local_90.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_90.ptr_._0_4_ = 600000000;
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)&gtest_ar,"600000000","asset_value",(int *)&local_90,(long *)&gtest_ar_
                );
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_90);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3c9,pcVar3);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_90.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_90.ptr_ + 8))();
          }
          local_90.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"0000000000000000000000000000000000000000000000000000000000000000\"",
                 "asset_blind_factor",
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 asset_blind_factor);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_90);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3cb,pcVar3);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_90.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_90.ptr_ + 8))();
          }
          local_90.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTRNE
                (asset_value_blind_factor,(char *)gtest_ar_.message_.ptr_,(char *)gtest_ar_._0_8_,
                 in_stack_ffffffffffffff18);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_90);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3cd,pcVar3);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_90.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_90.ptr_ + 8))();
          }
          local_90.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_90.ptr_ = local_90.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)&gtest_ar,"0","token_value",(int *)&local_90,&token_value);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_90);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3d1,pcVar3);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_90.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_90.ptr_ + 8))();
          }
          local_90.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(asset_value_blind_factor);
      CfdFreeStringBuffer(token);
      CfdFreeStringBuffer(token_blind_factor);
      CfdFreeStringBuffer(token_value_blind_factor);
    }
  }
  if (ret == 0) {
    asset = (char *)0x0;
    asset_blind_factor = (char *)0x0;
    ret = CfdUnblindTxOut(handle,tx_string,0,
                          "6a64f506be6e60b948987aa4d180d2ab05034a6a214146e06e28d4efe101d006",&asset,
                          &value,&asset_blind_factor,&value_blind_factor);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x3e1,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179\"","asset",
                 "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179",asset);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3e3,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar_._0_4_ = 0x3b947f60;
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)&gtest_ar,"999587680","value",(int *)&gtest_ar_,&value);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3e4,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTRNE
                (asset_value_blind_factor,(char *)gtest_ar_.message_.ptr_,(char *)gtest_ar_._0_8_,
                 in_stack_ffffffffffffff18);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3e6,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTRNE
                (asset_value_blind_factor,(char *)gtest_ar_.message_.ptr_,(char *)gtest_ar_._0_8_,
                 in_stack_ffffffffffffff18);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,999,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(value_blind_factor);
      asset = (char *)0x0;
      asset_blind_factor = (char *)0x0;
      value_blind_factor = (char *)0x0;
    }
  }
  if (ret == 0) {
    ret = CfdUnblindTxOut(handle,tx_string,1,
                          "94c85164605f589c4c572874f36b8301989c7fabfd44131297e95824d473681f",&asset,
                          &value,&asset_blind_factor,&value_blind_factor);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x3f5,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b\"","asset",
                 "ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b",asset);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3f7,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar_._0_4_ = 700000000;
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)&gtest_ar,"700000000","value",(int *)&gtest_ar_,&value);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3f8,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTRNE
                (asset_value_blind_factor,(char *)gtest_ar_.message_.ptr_,(char *)gtest_ar_._0_8_,
                 in_stack_ffffffffffffff18);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3fa,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTRNE
                (asset_value_blind_factor,(char *)gtest_ar_.message_.ptr_,(char *)gtest_ar_._0_8_,
                 in_stack_ffffffffffffff18);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3fb,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(value_blind_factor);
      asset = (char *)0x0;
      asset_blind_factor = (char *)0x0;
      value_blind_factor = (char *)0x0;
    }
  }
  if (ret == 0) {
    ret = CfdUnblindTxOut(handle,tx_string,3,
                          "0473d39aa6542e0c1bb6a2343b2319c3e92063dd019af4d47dbf50c460204f32",&asset,
                          &value,&asset_blind_factor,&value_blind_factor);
    gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x409,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
      if (gtest_ar_._0_8_ != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd\"","asset",
                 "accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd",asset);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x40b,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTRNE
                (asset_value_blind_factor,(char *)gtest_ar_.message_.ptr_,(char *)gtest_ar_._0_8_,
                 in_stack_ffffffffffffff18);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x40d,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTRNE
                (asset_value_blind_factor,(char *)gtest_ar_.message_.ptr_,(char *)gtest_ar_._0_8_,
                 in_stack_ffffffffffffff18);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x40e,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      gtest_ar_._0_4_ = 600000000;
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)&gtest_ar,"600000000","value",(int *)&gtest_ar_,&value);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x40f,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
        if (gtest_ar_._0_8_ != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          gtest_ar_.success_ = false;
          gtest_ar_._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(value_blind_factor);
      asset = (char *)0x0;
      asset_blind_factor = (char *)0x0;
      value_blind_factor = (char *)0x0;
    }
  }
  CfdFreeStringBuffer(tx_string);
  ret = CfdFreeHandle(handle);
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&gtest_ar_,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&asset_value_blind_factor,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x41c,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&asset_value_blind_factor,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&asset_value_blind_factor);
    if (gtest_ar_._0_8_ != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (gtest_ar_._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, BlindTransaction) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static const char* base_tx = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";

  char* tx_string = nullptr;
  int64_t satoshi;
  void* blind_handle = nullptr;
  ret = CfdInitializeBlindTx(handle, &blind_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    satoshi = 999637680;
    ret = CfdAddBlindTxInData(
        handle, blind_handle,
        "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
        "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179",
        "a10ecbe1be7a5f883d5d45d966e30dbc1beff5f21c55cec76cc21a2229116a9f",
        "ae0f46d1940f297c2dc3bbd82bf8ef6931a2431fbb05b3d3bc5df41af86ae808",
        satoshi, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    satoshi = 700000000;
    ret = CfdAddBlindTxInData(
        handle, blind_handle,
        "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 1,
        "ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b",
        "0b8954757234fd3ec9cf0dd6ef0a89d825ec56a9532e7da4b6cb90c51be3bbd8",
        "62e36e1f0fa4916b031648a6b6903083069fa587572a88b729250cde528cfd3b",
        satoshi, "7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f",
        "7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdAddBlindTxOutData(
        handle, blind_handle, 0,
        "02200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdAddBlindTxOutData(
        handle, blind_handle, 1,
        "02cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdAddBlindTxOutByAddress(
        handle, blind_handle,
        "CTExCoUri8VzkxbbhqzgsruWJ5zYtmoFXxCWtjiSLAzcMbpEWhHmDrZ66bAb41VsmSKnvJWrq2cfjUw9");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdSetBlindTxOption(
        handle, blind_handle, kCfdBlindOptionMinimumRangeValue, 1);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdSetBlindTxOption(
        handle, blind_handle, kCfdBlindOptionExponent, 0);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdSetBlindTxOption(
        handle, blind_handle, kCfdBlindOptionMinimumBits, 52);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdSetBlindTxOption(
        handle, blind_handle, kCfdBlindOptionCollectBlinder, 1);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdFinalizeBlindTx(handle, blind_handle, base_tx, &tx_string);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  uint32_t vout = 0;
  int64_t value = 0;
  char* asset = nullptr;
  char* asset_blind_factor = nullptr;
  char* value_blind_factor = nullptr;
  char* issuance_txid = nullptr;
  uint32_t issuance_vout = 0;
  bool is_issuance_asset = false;
  bool is_issuance_token = false;
  const char* empty_factor = "0000000000000000000000000000000000000000000000000000000000000000";
  if (ret == kCfdSuccess) {
    // blind is contains random value.
    // EXPECT_STREQ("", tx_string);
    ret = CfdGetBlindTxBlindData(handle, blind_handle, 0,
        &vout, &asset, &value, &asset_blind_factor,
        &value_blind_factor, &issuance_txid, &issuance_vout,
        &is_issuance_asset, &is_issuance_token);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      // reissuance: 600000000
      EXPECT_EQ(1, vout);
      EXPECT_STREQ("accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd", asset);
      EXPECT_EQ(600000000, value);
      EXPECT_STREQ(empty_factor, asset_blind_factor);
      EXPECT_STRNE(empty_factor, value_blind_factor);
      EXPECT_STREQ("57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",
          issuance_txid);
      EXPECT_EQ(1, issuance_vout);
      EXPECT_TRUE(is_issuance_asset);
      EXPECT_FALSE(is_issuance_token);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(value_blind_factor);
      CfdFreeStringBuffer(issuance_txid);
      asset = nullptr;
      asset_blind_factor = nullptr;
      value_blind_factor = nullptr;
      issuance_txid = nullptr;
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetBlindTxBlindData(handle, blind_handle, 2,
        &vout, &asset, &value, &asset_blind_factor,
        &value_blind_factor, &issuance_txid, &issuance_vout,
        &is_issuance_asset, &is_issuance_token);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      // txout[1]: 700000000
      EXPECT_EQ(1, vout);
      EXPECT_STREQ("ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b", asset);
      EXPECT_EQ(700000000, value);
      EXPECT_STRNE(empty_factor, asset_blind_factor);
      EXPECT_STRNE(empty_factor, value_blind_factor);
      EXPECT_STREQ("", issuance_txid);
      EXPECT_EQ(0, issuance_vout);
      EXPECT_FALSE(is_issuance_asset);
      EXPECT_FALSE(is_issuance_token);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(value_blind_factor);
      CfdFreeStringBuffer(issuance_txid);
      asset = nullptr;
      asset_blind_factor = nullptr;
      value_blind_factor = nullptr;
      issuance_txid = nullptr;
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetBlindTxBlindData(handle, blind_handle, 4,
        &vout, &asset, &value, &asset_blind_factor,
        &value_blind_factor, &issuance_txid, &issuance_vout,
        &is_issuance_asset, &is_issuance_token);
    EXPECT_EQ(kCfdOutOfRangeError, ret);
    if (ret == kCfdOutOfRangeError) ret = kCfdSuccess;
  }

  if (blind_handle != nullptr) {
    CfdFreeBlindHandle(handle, blind_handle);
  }

  // unblind test
  if (ret == kCfdSuccess) {
    int64_t asset_value;
    char* asset_value_blind_factor = nullptr;
    char* token = nullptr;
    int64_t token_value = 0;
    char* token_blind_factor = nullptr;
    char* token_value_blind_factor = nullptr;
    ret = CfdUnblindIssuance(
        handle, tx_string, 1,
        "7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f",
        "7d65c7970d836a878a1080399a3c11de39a8e82493e12b1ad154e383661fb77f",
        &asset, &asset_value, &asset_blind_factor,
        &asset_value_blind_factor, &token, &token_value,
        &token_blind_factor, &token_value_blind_factor);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd", asset);
      EXPECT_EQ(600000000, asset_value);
      // asset is calculate from utxo txin and vout.
      EXPECT_STREQ("0000000000000000000000000000000000000000000000000000000000000000", asset_blind_factor);
      // blind factor is generate from random value.
      EXPECT_STRNE("0000000000000000000000000000000000000000000000000000000000000000", asset_value_blind_factor);
      // EXPECT_STREQ("", token);
      // EXPECT_STREQ("", token_blind_factor);
      // EXPECT_STREQ("", token_value_blind_factor);
      EXPECT_EQ(0, token_value);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(asset_value_blind_factor);
      CfdFreeStringBuffer(token);
      CfdFreeStringBuffer(token_blind_factor);
      CfdFreeStringBuffer(token_value_blind_factor);
    }
  }

  if (ret == kCfdSuccess) {
    asset = nullptr;
    asset_blind_factor = nullptr;
    ret = CfdUnblindTxOut(
        handle, tx_string, 0, "6a64f506be6e60b948987aa4d180d2ab05034a6a214146e06e28d4efe101d006",
        &asset, &value, &asset_blind_factor, &value_blind_factor);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179", asset);
      EXPECT_EQ(999587680, value);
      // blind factor is generate from random value.
      EXPECT_STRNE("0000000000000000000000000000000000000000000000000000000000000000", asset_blind_factor);
      EXPECT_STRNE("0000000000000000000000000000000000000000000000000000000000000000", value_blind_factor);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(value_blind_factor);
      asset = nullptr;
      asset_blind_factor = nullptr;
      value_blind_factor = nullptr;
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdUnblindTxOut(
        handle, tx_string, 1, "94c85164605f589c4c572874f36b8301989c7fabfd44131297e95824d473681f",
        &asset, &value, &asset_blind_factor, &value_blind_factor);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("ed6927df918c89b5e3d8b5062acab2c749a3291bb7451d4267c7daaf1b52ad0b", asset);
      EXPECT_EQ(700000000, value);
      // blind factor is generate from random value.
      EXPECT_STRNE("0000000000000000000000000000000000000000000000000000000000000000", asset_blind_factor);
      EXPECT_STRNE("0000000000000000000000000000000000000000000000000000000000000000", value_blind_factor);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(value_blind_factor);
      asset = nullptr;
      asset_blind_factor = nullptr;
      value_blind_factor = nullptr;
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdUnblindTxOut(
        handle, tx_string, 3, "0473d39aa6542e0c1bb6a2343b2319c3e92063dd019af4d47dbf50c460204f32",
        &asset, &value, &asset_blind_factor, &value_blind_factor);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("accb7354c07974e00b32e4e5eef55078490141675592ac3610e6101831edb0cd", asset);
      // blind factor is generate from random value.
      EXPECT_STRNE("0000000000000000000000000000000000000000000000000000000000000000", asset_blind_factor);
      EXPECT_STRNE("0000000000000000000000000000000000000000000000000000000000000000", value_blind_factor);
      EXPECT_EQ(600000000, value);
      CfdFreeStringBuffer(asset);
      CfdFreeStringBuffer(asset_blind_factor);
      CfdFreeStringBuffer(value_blind_factor);
      asset = nullptr;
      asset_blind_factor = nullptr;
      value_blind_factor = nullptr;
    }
  }

  CfdFreeStringBuffer(tx_string);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}